

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O1

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  int iVar1;
  exchcxx_exception *this_00;
  string local_68;
  string local_48;
  
  throw_if_uninitialized(this);
  iVar1 = (*(this->super_XCKernelImpl)._vptr_XCKernelImpl[3])(this);
  if ((char)iVar1 != '\0') {
    xc_lda_exc(&this->kernel_,(long)N,rho,eps);
    return;
  }
  this_00 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"KERNEL IS NOT LDA","");
  exchcxx_exception::exchcxx_exception(this_00,&local_48,0x105,&local_68);
  __cxa_throw(this_00,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

LDA_EXC_GENERATOR( LibxcKernelImpl::eval_exc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT LDA",  is_lda() );
  xc_lda_exc( &kernel_, N, rho, eps );

}